

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

void Llb_ImgSchedule(Vec_Ptr_t *vSupps,Vec_Ptr_t **pvQuant0,Vec_Ptr_t **pvQuant1,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  int local_48;
  uint local_44;
  int k;
  int i;
  int Entry;
  int iSupp;
  int Counter;
  int nVarsAll;
  Vec_Int_t *vOne;
  int fVerbose_local;
  Vec_Ptr_t **pvQuant1_local;
  Vec_Ptr_t **pvQuant0_local;
  Vec_Ptr_t *vSupps_local;
  
  i = -1;
  iVar1 = Vec_PtrSize(vSupps);
  pVVar4 = Vec_PtrAlloc(iVar1);
  *pvQuant0 = pVVar4;
  iVar1 = Vec_PtrSize(vSupps);
  pVVar4 = Vec_PtrAlloc(iVar1);
  *pvQuant1 = pVVar4;
  for (local_48 = 0; iVar1 = Vec_PtrSize(vSupps), local_48 < iVar1; local_48 = local_48 + 1) {
    Vec_PtrEntry(vSupps,local_48);
    pVVar4 = *pvQuant0;
    pVVar5 = Vec_IntAlloc(0x10);
    Vec_PtrPush(pVVar4,pVVar5);
    pVVar4 = *pvQuant1;
    pVVar5 = Vec_IntAlloc(0x10);
    Vec_PtrPush(pVVar4,pVVar5);
  }
  pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vSupps,0);
  iVar1 = Vec_IntSize(pVVar5);
  for (local_44 = 0; (int)local_44 < iVar1; local_44 = local_44 + 1) {
    Entry = 0;
    for (local_48 = 0; iVar2 = Vec_PtrSize(vSupps), local_48 < iVar2; local_48 = local_48 + 1) {
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(vSupps,local_48);
      iVar2 = Vec_IntEntry(pVVar5,local_44);
      if (iVar2 != 0) {
        i = local_48;
        Entry = Entry + 1;
      }
    }
    if (Entry != 0) {
      if (Entry == 1) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant0,i);
        Vec_IntPush(pVVar5,local_44);
      }
      else {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant1,i);
        Vec_IntPush(pVVar5,local_44);
      }
    }
  }
  if (fVerbose != 0) {
    for (local_44 = 0; iVar1 = Vec_PtrSize(vSupps), (int)local_44 < iVar1; local_44 = local_44 + 1)
    {
      printf("%2d : Quant0 = ",(ulong)local_44);
      local_48 = 0;
      while( true ) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant0,local_44);
        iVar1 = Vec_IntSize(pVVar5);
        if (iVar1 <= local_48) break;
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant0,local_44);
        uVar3 = Vec_IntEntry(pVVar5,local_48);
        printf("%d ",(ulong)uVar3);
        local_48 = local_48 + 1;
      }
      printf("\n");
    }
  }
  if (fVerbose != 0) {
    for (local_44 = 0; iVar1 = Vec_PtrSize(vSupps), (int)local_44 < iVar1; local_44 = local_44 + 1)
    {
      printf("%2d : Quant1 = ",(ulong)local_44);
      local_48 = 0;
      while( true ) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant1,local_44);
        iVar1 = Vec_IntSize(pVVar5);
        if (iVar1 <= local_48) break;
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant1,local_44);
        uVar3 = Vec_IntEntry(pVVar5,local_48);
        printf("%d ",(ulong)uVar3);
        local_48 = local_48 + 1;
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Llb_ImgSchedule( Vec_Ptr_t * vSupps, Vec_Ptr_t ** pvQuant0, Vec_Ptr_t ** pvQuant1, int fVerbose )
{
    Vec_Int_t * vOne;
    int nVarsAll, Counter, iSupp = -1, Entry, i, k;
    // start quantification arrays
    *pvQuant0 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    *pvQuant1 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
    {
        Vec_PtrPush( *pvQuant0, Vec_IntAlloc(16) );
        Vec_PtrPush( *pvQuant1, Vec_IntAlloc(16) );
    }
    // count how many times each var appears
    nVarsAll = Vec_IntSize( (Vec_Int_t *)Vec_PtrEntry(vSupps, 0) );
    for ( i = 0; i < nVarsAll; i++ )
    {
        Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            if ( Vec_IntEntry(vOne, i) )
            {
                iSupp = k;
                Counter++;
            }
        if ( Counter == 0 )
            continue;
        if ( Counter == 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, iSupp), i );
        else // if ( Counter > 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, iSupp), i );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant0 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant1 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }
}